

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextEditPrivate::setTopBlock
          (QPlainTextEditPrivate *this,int blockNumber,int lineNumber,int dx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPlainTextEdit *this_00;
  int *piVar4;
  ulong uVar5;
  QPlainTextEditPrivate *this_01;
  QFlags_conflict1 *pQVar6;
  int in_ECX;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar7;
  qreal qVar8;
  qreal realdy;
  int dy;
  int maxTopLine;
  int newTopLine;
  QTextDocument *doc;
  QPlainTextEdit *q;
  QTextBlock block;
  QWidget *in_stack_fffffffffffffef8;
  QPlainTextEditPrivate *in_stack_ffffffffffffff00;
  QTextBlock *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  QWidget *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  QRectF local_68;
  int local_48 [3];
  int local_3c;
  undefined1 local_38 [16];
  QTextBlock local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  local_48[1] = 0;
  piVar4 = qMax<int>(local_48 + 1,&local_3c);
  local_3c = *piVar4;
  local_48[0] = 0;
  piVar4 = qMax<int>(local_48,local_48 + 2);
  local_48[2] = *piVar4;
  QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffff00);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::findBlockByNumber((int)local_18);
  iVar2 = QTextBlock::firstLineNumber();
  iVar2 = iVar2 + local_48[2];
  iVar3 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff00);
  if (iVar3 < iVar2) {
    QTextDocument::findBlockByLineNumber((int)&local_28);
    QTextBlock::operator=((QTextBlock *)local_18,&local_28);
    local_3c = QTextBlock::blockNumber();
    local_48[2] = QTextBlock::firstLineNumber();
    local_48[2] = iVar3 - local_48[2];
  }
  QAbstractSlider::setValue((QAbstractSlider *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  if (((in_ECX != 0) || (local_3c != in_RDI->control->topBlock)) || (local_48[2] != in_RDI->topLine)
     ) {
    bVar1 = QWidget::updatesEnabled((QWidget *)0x6c12ef);
    if ((bVar1) && (bVar1 = QWidget::isVisible((QWidget *)0x6c1309), bVar1)) {
      iVar2 = 0;
      QTextDocument::findBlockByNumber((int)local_38);
      uVar5 = QTextBlock::isValid();
      if ((uVar5 & 1) != 0) {
        QPlainTextEdit::blockBoundingGeometry
                  ((QPlainTextEdit *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        qVar7 = QRectF::y(&local_68);
        this_01 = (QPlainTextEditPrivate *)((ulong)qVar7 ^ 0x8000000000000000);
        qVar7 = verticalOffset(in_stack_ffffffffffffff00);
        qVar8 = verticalOffset(this_01,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                               (int)in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff50 = ((double)this_01 + qVar7) - qVar8;
        iVar2 = (int)in_stack_ffffffffffffff50;
        in_RDI->topLineFracture = in_stack_ffffffffffffff50 - (double)iVar2;
      }
      iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      in_RDI->control->topBlock = local_3c;
      in_RDI->topLine = local_48[2];
      QTextBlock::firstLineNumber();
      QAbstractSlider::setValue
                ((QAbstractSlider *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      if ((in_ECX == 0) && (iVar2 == 0)) {
        QWidget::update(in_stack_fffffffffffffef8);
        in_RDI->topLineFracture = 0.0;
      }
      else {
        in_stack_ffffffffffffff18 = (in_RDI->super_QAbstractScrollAreaPrivate).viewport;
        QWidget::isRightToLeft((QWidget *)0x6c147f);
        QWidget::scroll((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffff58),
                        (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                        SUB84(in_stack_ffffffffffffff50,0));
        pQVar6 = (QFlags_conflict1 *)QGuiApplication::inputMethod();
        Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                      (enum_type)in_stack_ffffffffffffff00);
        QInputMethod::update(pQVar6);
        iVar3 = (int)((ulong)pQVar6 >> 0x20);
      }
      QWidget::rect(in_stack_ffffffffffffff18);
      QPlainTextEdit::updateRequest(this_00,(QRect *)in_stack_fffffffffffffef8,iVar3);
    }
    else {
      in_RDI->control->topBlock = local_3c;
      in_RDI->topLine = local_48[2];
      in_RDI->topLineFracture = 0.0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::setTopBlock(int blockNumber, int lineNumber, int dx)
{
    Q_Q(QPlainTextEdit);
    blockNumber = qMax(0, blockNumber);
    lineNumber = qMax(0, lineNumber);
    QTextDocument *doc = control->document();
    QTextBlock block = doc->findBlockByNumber(blockNumber);

    int newTopLine = block.firstLineNumber() + lineNumber;
    int maxTopLine = vbar->maximum();

    if (newTopLine > maxTopLine) {
        block = doc->findBlockByLineNumber(maxTopLine);
        blockNumber = block.blockNumber();
        lineNumber = maxTopLine - block.firstLineNumber();
    }

    vbar->setValue(newTopLine);

    if (!dx && blockNumber == control->topBlock && lineNumber == topLine)
        return;

    if (viewport->updatesEnabled() && viewport->isVisible()) {
        int dy = 0;
        if (doc->findBlockByNumber(control->topBlock).isValid()) {
            qreal realdy = -q->blockBoundingGeometry(block).y()
                    + verticalOffset() - verticalOffset(blockNumber, lineNumber);
            dy = (int)realdy;
            topLineFracture = realdy - dy;
        }
        control->topBlock = blockNumber;
        topLine = lineNumber;

        vbar->setValue(block.firstLineNumber() + lineNumber);

        if (dx || dy) {
            viewport->scroll(q->isRightToLeft() ? -dx : dx, dy);
            QGuiApplication::inputMethod()->update(Qt::ImCursorRectangle | Qt::ImAnchorRectangle);
        } else {
            viewport->update();
            topLineFracture = 0;
        }
        emit q->updateRequest(viewport->rect(), dy);
    } else {
        control->topBlock = blockNumber;
        topLine = lineNumber;
        topLineFracture = 0;
    }

}